

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  JsonNode *pJVar1;
  int iVar2;
  u32 uVar3;
  uint uVar4;
  JsonNode *pJVar5;
  bool bVar6;
  JsonNode *pNode_1;
  uint local_78;
  u32 iStart_1;
  uint x;
  int iBase;
  JsonNode *pBase;
  JsonNode *pNode;
  u32 iLabel;
  u32 iStart;
  JsonNode *pRoot;
  char *zKey;
  uint local_40;
  u32 nKey;
  u32 j;
  u32 i;
  char **pzErr_local;
  int *pApnd_local;
  char *zPath_local;
  u32 iRoot_local;
  JsonParse *pParse_local;
  
  _iLabel = (JsonParse *)(pParse->aNode + iRoot);
  pParse_local = _iLabel;
  if (*zPath != '\0') {
    if ((_iLabel->nNode & 0x800) == 0) {
      zPath_local._4_4_ = iRoot;
      if (*zPath == '.') {
        if ((u8)_iLabel->nNode != '\a') {
          return (JsonNode *)0x0;
        }
        pJVar5 = (JsonNode *)(zPath + 1);
        if (pJVar5->eType == '\"') {
          nKey = 1;
          while( true ) {
            bVar6 = false;
            if ((&pJVar5->eType)[nKey] != '\0') {
              bVar6 = (&pJVar5->eType)[nKey] != '\"';
            }
            if (!bVar6) break;
            nKey = nKey + 1;
          }
          zKey._4_4_ = nKey - 1;
          if ((&pJVar5->eType)[nKey] == '\0') {
            *pzErr = (char *)pJVar5;
            return (JsonNode *)0x0;
          }
          nKey = nKey + 1;
          pRoot = (JsonNode *)(zPath + 2);
        }
        else {
          nKey = 0;
          while( true ) {
            bVar6 = false;
            if (((&pJVar5->eType)[nKey] != '\0') && (bVar6 = false, (&pJVar5->eType)[nKey] != '.'))
            {
              bVar6 = (&pJVar5->eType)[nKey] != '[';
            }
            if (!bVar6) break;
            nKey = nKey + 1;
          }
          zKey._4_4_ = nKey;
          pRoot = pJVar5;
          if (nKey == 0) {
            *pzErr = (char *)pJVar5;
            return (JsonNode *)0x0;
          }
        }
        while( true ) {
          for (local_40 = 1; local_40 <= _iLabel->nAlloc; local_40 = uVar3 + local_40 + 1) {
            iVar2 = jsonLabelCompare((JsonNode *)(&_iLabel->nNode + (ulong)local_40 * 4),
                                     (char *)pRoot,zKey._4_4_);
            if (iVar2 != 0) {
              pJVar5 = jsonLookupStep(pParse,zPath_local._4_4_ + local_40 + 1,
                                      (char *)(&pJVar5->eType + nKey),pApnd,pzErr);
              return pJVar5;
            }
            uVar3 = jsonNodeSize((JsonNode *)(&_iLabel->nNode + (ulong)(local_40 + 1) * 4));
          }
          if ((_iLabel->nNode & 0x2000) == 0) break;
          zPath_local._4_4_ =
               ((anon_union_8_5_9b08aacb_for_u *)&_iLabel->aNode)->iAppend + zPath_local._4_4_;
          _iLabel = (JsonParse *)(pParse->aNode + zPath_local._4_4_);
        }
        if (pApnd != (int *)0x0) {
          iVar2 = jsonParseAddNode(pParse,7,2,(char *)0x0);
          uVar4 = jsonParseAddNode(pParse,5,zKey._4_4_,(char *)pRoot);
          pJVar5 = jsonLookupAppend(pParse,(char *)(&pJVar5->eType + nKey),pApnd,pzErr);
          if (pParse->oom != '\0') {
            return (JsonNode *)0x0;
          }
          if (pJVar5 == (JsonNode *)0x0) {
            return (JsonNode *)0x0;
          }
          pJVar1 = pParse->aNode;
          pJVar1[zPath_local._4_4_].u.iAppend = iVar2 - zPath_local._4_4_;
          pJVar1[zPath_local._4_4_].jnFlags = pJVar1[zPath_local._4_4_].jnFlags | 0x20;
          pParse->aNode[uVar4].jnFlags = pParse->aNode[uVar4].jnFlags | 1;
          return pJVar5;
        }
      }
      else if (*zPath == '[') {
        nKey = 0;
        local_40 = 1;
        while ((""[(byte)zPath[local_40]] & 4) != 0) {
          nKey = (nKey * 10 + (int)zPath[local_40]) - 0x30;
          local_40 = local_40 + 1;
        }
        if ((local_40 < 2) || (zPath[local_40] != ']')) {
          if (zPath[1] != '#') {
            *pzErr = zPath;
            return (JsonNode *)0x0;
          }
          _x = _iLabel;
          iStart_1 = iRoot;
          if ((u8)_iLabel->nNode != '\x06') {
            return (JsonNode *)0x0;
          }
          while( true ) {
            for (; local_40 <= _x->nAlloc; local_40 = uVar3 + local_40) {
              if ((*(u8 *)((long)&_x->nNode + (ulong)local_40 * 0x10 + 1) & 4) == 0) {
                nKey = nKey + 1;
              }
              uVar3 = jsonNodeSize((JsonNode *)(&_x->nNode + (ulong)local_40 * 4));
            }
            if ((_x->nNode & 0x2000) == 0) break;
            iStart_1 = ((anon_union_8_5_9b08aacb_for_u *)&_x->aNode)->iAppend + iStart_1;
            _x = (JsonParse *)(pParse->aNode + (int)iStart_1);
            local_40 = 1;
          }
          local_40 = 2;
          if ((zPath[2] == '-') && ((""[(byte)zPath[3]] & 4) != 0)) {
            local_78 = 0;
            local_40 = 3;
            do {
              local_78 = (local_78 * 10 + (int)zPath[local_40]) - 0x30;
              local_40 = local_40 + 1;
            } while ((""[(byte)zPath[local_40]] & 4) != 0);
            if (nKey < local_78) {
              return (JsonNode *)0x0;
            }
            nKey = nKey - local_78;
          }
          if (zPath[local_40] != ']') {
            *pzErr = zPath;
            return (JsonNode *)0x0;
          }
        }
        if ((u8)_iLabel->nNode != '\x06') {
          return (JsonNode *)0x0;
        }
        uVar4 = local_40 + 1;
        while( true ) {
          local_40 = 1;
          while( true ) {
            bVar6 = false;
            if ((local_40 <= _iLabel->nAlloc) && (bVar6 = true, nKey == 0)) {
              bVar6 = (*(u8 *)((long)&_iLabel->nNode + (ulong)local_40 * 0x10 + 1) & 4) != 0;
            }
            if (!bVar6) break;
            if ((*(u8 *)((long)&_iLabel->nNode + (ulong)local_40 * 0x10 + 1) & 4) == 0) {
              nKey = nKey - 1;
            }
            uVar3 = jsonNodeSize((JsonNode *)(&_iLabel->nNode + (ulong)local_40 * 4));
            local_40 = uVar3 + local_40;
          }
          if ((_iLabel->nNode & 0x2000) == 0) break;
          zPath_local._4_4_ =
               ((anon_union_8_5_9b08aacb_for_u *)&_iLabel->aNode)->iAppend + zPath_local._4_4_;
          _iLabel = (JsonParse *)(pParse->aNode + zPath_local._4_4_);
        }
        if (local_40 <= _iLabel->nAlloc) {
          pJVar5 = jsonLookupStep(pParse,zPath_local._4_4_ + local_40,zPath + uVar4,pApnd,pzErr);
          return pJVar5;
        }
        if ((nKey == 0) && (pApnd != (int *)0x0)) {
          iVar2 = jsonParseAddNode(pParse,6,1,(char *)0x0);
          pJVar5 = jsonLookupAppend(pParse,zPath + uVar4,pApnd,pzErr);
          if (pParse->oom != '\0') {
            return (JsonNode *)0x0;
          }
          if (pJVar5 == (JsonNode *)0x0) {
            return (JsonNode *)0x0;
          }
          pJVar1 = pParse->aNode;
          pJVar1[zPath_local._4_4_].u.iAppend = iVar2 - zPath_local._4_4_;
          pJVar1[zPath_local._4_4_].jnFlags = pJVar1[zPath_local._4_4_].jnFlags | 0x20;
          return pJVar5;
        }
      }
      else {
        *pzErr = zPath;
      }
      pParse_local = (JsonParse *)0x0;
    }
    else {
      pParse_local = (JsonParse *)0x0;
    }
  }
  return (JsonNode *)pParse_local;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( pRoot->jnFlags & JNODE_REPLACE ) return 0;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
      testcase( nKey==0 );
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        *pzErr = zPath;
        return 0;
      }
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' ){
    i = 0;
    j = 1;
    while( sqlite3Isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( j<2 || zPath[j]!=']' ){
      if( zPath[1]=='#' ){
        JsonNode *pBase = pRoot;
        int iBase = iRoot;
        if( pRoot->eType!=JSON_ARRAY ) return 0;
        for(;;){
          while( j<=pBase->n ){
            if( (pBase[j].jnFlags & JNODE_REMOVE)==0 ) i++;
            j += jsonNodeSize(&pBase[j]);
          }
          if( (pBase->jnFlags & JNODE_APPEND)==0 ) break;
          assert( pBase->eU==2 );
          iBase += pBase->u.iAppend;
          pBase = &pParse->aNode[iBase];
          j = 1;
        }
        j = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int x = 0;
          j = 3;
          do{
            x = x*10 + zPath[j] - '0';
            j++;
          }while( sqlite3Isdigit(zPath[j]) );
          if( x>i ) return 0;
          i -= x;
        }
        if( zPath[j]!=']' ){
          *pzErr = zPath;
          return 0;
        }
      }else{
        *pzErr = zPath;
        return 0;
      }
    }
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}